

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.c
# Opt level: O0

ASTNode * ParseIdent(Scope *scope,Lexer *lexer)

{
  undefined1 local_30 [8];
  PeekedToken peeked;
  Lexer *lexer_local;
  Scope *scope_local;
  
  peeked.raw = (char *)lexer;
  PeekNextToken(lexer,(PeekedToken *)local_30);
  if (local_30._0_4_ == LPAREN) {
    scope_local = (Scope *)ParseFuncCall(scope,(Lexer *)peeked.raw);
  }
  else {
    BackOneToken((Lexer *)peeked.raw);
    scope_local = (Scope *)ParseExpression(scope,(Lexer *)peeked.raw);
  }
  return (ASTNode *)scope_local;
}

Assistant:

ASTNode* ParseIdent(Scope* scope, Lexer* lexer){
	DEBUG_PRINT_SYNTAX("Ident");
	TRACK();
	PeekedToken peeked;
	PeekNextToken(lexer, &peeked);
	if (peeked.token == LPAREN){
		return ParseFuncCall(scope, lexer);
	}
	BackOneToken(lexer);
	return ParseExpression(scope, lexer);
}